

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChUtilsGenerators.cpp
# Opt level: O2

void __thiscall
chrono::utils::Generator::CreateObjectsBox
          (Generator *this,ChVector<double> *dist,ChVector<double> *pos,ChVector<double> *hdims,
          ChVector<double> *vel)

{
  int iVar1;
  PointVector points;
  undefined1 local_b8 [16];
  pointer local_a8;
  _Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_> local_a0;
  Sampler<double> local_88;
  undefined1 local_48 [16];
  double local_38;
  
  normalizeMixture(this);
  iVar1 = (*(this->m_system->super_ChIntegrableIIorder).super_ChIntegrable._vptr_ChIntegrable[0x2f])
                    ();
  if (iVar1 == 1) {
    calcMinSeparation((ChVector<double> *)&local_88,this,dist);
    local_48._8_8_ = local_88.m_separation;
    local_48._0_8_ = local_88._vptr_Sampler;
    local_38 = local_88.m_center.m_data[0];
  }
  else {
    local_48 = *(undefined1 (*) [16])dist->m_data;
    local_38 = dist->m_data[2];
  }
  local_a8 = (pointer)0x0;
  local_88.m_separation = (double)vmovlps_avx(local_48);
  local_88.m_center.m_data[0] = 0.0;
  local_88.m_center.m_data[1] = 0.0;
  local_88.m_center.m_data[2] = 0.0;
  local_88.m_size.m_data[0] = 0.0;
  local_88.m_size.m_data[1] = 0.0;
  local_88.m_size.m_data[2] = 0.0;
  local_88._vptr_Sampler = (_func_int **)&PTR__Sampler_01198a58;
  local_b8 = ZEXT816(0) << 0x20;
  Sampler<double>::SampleBox((PointVector *)&local_a0,&local_88,pos,hdims);
  std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>::_M_move_assign
            ((vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_> *)
             local_b8,&local_a0);
  std::_Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>::
  ~_Vector_base(&local_a0);
  createObjects(this,(PointVector *)local_b8,vel);
  std::_Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>::
  ~_Vector_base((_Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                 *)local_b8);
  return;
}

Assistant:

void Generator::CreateObjectsBox(const ChVector<>& dist,
                                 const ChVector<>& pos,
                                 const ChVector<>& hdims,
                                 const ChVector<>& vel) {
    // Normalize the mixture ratios
    normalizeMixture();

    // When using SMC, make sure there is no shape overlap.
    ChVector<> distv;
    if (m_system->GetContactMethod() == ChContactMethod::SMC)
        distv = calcMinSeparation(dist);
    else
        distv = dist;

    // Generate the object locations
    GridSampler<> sampler(distv);
    PointVector points;
    points = sampler.SampleBox(pos, hdims);

    createObjects(points, vel);
}